

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O2

void __thiscall
ScopeLocal::makeNameRecommendationsForSymbols
          (ScopeLocal *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *resname,vector<Symbol_*,_std::allocator<Symbol_*>_> *ressym)

{
  _Rb_tree_node_base *addr;
  _Rb_tree_color s;
  _Base_ptr p_Var1;
  bool bVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  HighVariable *pHVar5;
  _Rb_tree_node_base *p_Var6;
  Varnode *this_00;
  VarnodeBank *this_01;
  _List_node_base *p_Var7;
  Symbol *sym_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  DynamicHash dhash;
  
  p_Var6 = (this->nameRecommend)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var6 == &(this->nameRecommend)._M_t._M_impl.super__Rb_tree_header) {
      p_Var7 = (this->dynRecommend).
               super__List_base<DynamicRecommend,_std::allocator<DynamicRecommend>_>._M_impl._M_node
               .super__List_node_base._M_next;
      if (p_Var7 != (_List_node_base *)&this->dynRecommend) {
        dhash.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        dhash.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dhash.vnedge.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dhash.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        dhash.vnedge.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        dhash.vnedge.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        dhash.markvn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        dhash.markvn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dhash.addrresult.base = (AddrSpace *)0x0;
        dhash.markop.super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dhash.markvn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        dhash.markop.super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        dhash.markop.super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        for (; p_Var7 != (_List_node_base *)&this->dynRecommend; p_Var7 = p_Var7->_M_next) {
          DynamicHash::clear(&dhash);
          this_00 = DynamicHash::findVarnode
                              (&dhash,(this->super_ScopeInternal).super_Scope.fd,
                               (Address *)(p_Var7 + 1),(uint8)p_Var7[2]._M_next);
          if ((this_00 != (Varnode *)0x0) && ((this_00->flags & 4) == 0)) {
            pHVar5 = Varnode::getHigh(this_00);
            sym_1 = pHVar5->symbol;
            if ((sym_1 != (Symbol *)0x0) && (bVar2 = Symbol::isNameUndefined(sym_1), bVar2)) {
              std::__cxx11::string::string((string *)&local_d8,(string *)&p_Var7[2]._M_prev);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         resname,&local_d8);
              std::__cxx11::string::~string((string *)&local_d8);
              std::vector<Symbol_*,_std::allocator<Symbol_*>_>::push_back(ressym,&sym_1);
            }
          }
        }
        DynamicHash::~DynamicHash(&dhash);
      }
      return;
    }
    addr = p_Var6 + 1;
    s = p_Var6[2]._M_color;
    p_Var1 = p_Var6[1]._M_left;
    this_01 = &((this->super_ScopeInternal).super_Scope.fd)->vbank;
    if (p_Var1 == (_Base_ptr)0x0) {
      cVar3 = VarnodeBank::beginLoc(this_01,s,(Address *)addr);
      cVar4 = VarnodeBank::endLoc(&((this->super_ScopeInternal).super_Scope.fd)->vbank,s,
                                  (Address *)addr);
    }
    else {
      cVar3 = VarnodeBank::beginLoc
                        (this_01,s,(Address *)addr,(Address *)&p_Var6[1]._M_left,0xffffffff);
      cVar4 = VarnodeBank::endLoc(&((this->super_ScopeInternal).super_Scope.fd)->vbank,s,
                                  (Address *)addr,(Address *)&p_Var6[1]._M_left,0xffffffff);
    }
    for (; cVar3._M_node != cVar4._M_node;
        cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node)) {
      if (((*(Varnode **)(cVar3._M_node + 1))->flags & 4) == 0) {
        pHVar5 = Varnode::getHigh(*(Varnode **)(cVar3._M_node + 1));
        dhash._0_8_ = pHVar5->symbol;
        if (((Symbol *)dhash._0_8_ != (Symbol *)0x0) &&
           (bVar2 = Symbol::isNameUndefined((Symbol *)dhash._0_8_), bVar2)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(resname,(value_type *)&p_Var6[2]._M_parent);
          std::vector<Symbol_*,_std::allocator<Symbol_*>_>::push_back(ressym,(value_type *)&dhash);
          break;
        }
      }
      if (p_Var1 == (_Base_ptr)0x0) break;
    }
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

void ScopeLocal::makeNameRecommendationsForSymbols(vector<string> &resname,vector<Symbol *> &ressym) const

{ 				// Find nameable symbols with a varnode rep matching a name recommendation
  map<AddressUsePointPair,string>::const_iterator iter;
  for(iter=nameRecommend.begin();iter!=nameRecommend.end();++iter) {
    VarnodeLocSet::const_iterator biter,eiter;
    bool isaddrtied;
    const Address &addr((*iter).first.getAddr());
    const Address &useaddr((*iter).first.getUseAddr());
    int4 size = (*iter).first.getSize();
    if (useaddr.isInvalid()) {
      isaddrtied = true;
      biter = fd->beginLoc(size,addr);
      eiter = fd->endLoc(size,addr);
    }
    else {
      isaddrtied = false;
      biter = fd->beginLoc(size,addr,useaddr);
      eiter = fd->endLoc(size,addr,useaddr);
    }
    while(biter != eiter) {
      Varnode *vn = *biter;
      if (!vn->isAnnotation()) {
	Symbol *sym = vn->getHigh()->getSymbol();
	if (sym != (Symbol *)0) {
	  if (sym->isNameUndefined()) {
	    resname.push_back( (*iter).second);
	    ressym.push_back(sym);
	    break;
	  }
	}
      }
      if (isaddrtied) break;
      ++biter;
    }
  }

  if (dynRecommend.empty()) return;

  list<DynamicRecommend>::const_iterator dyniter;
  DynamicHash dhash;
  for(dyniter=dynRecommend.begin();dyniter!=dynRecommend.end();++dyniter) {
    dhash.clear();
    const DynamicRecommend &dynEntry(*dyniter);
    Varnode *vn = dhash.findVarnode(fd, dynEntry.getAddress(), dynEntry.getHash());
    if (vn == (Varnode *)0) continue;
    if (vn->isAnnotation()) continue;
    Symbol *sym = vn->getHigh()->getSymbol();
    if (sym != (Symbol *)0) {
      if (sym->isNameUndefined()) {
	resname.push_back( dynEntry.getName() );
	ressym.push_back(sym);
      }
    }
  }
}